

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<SplitStringTest,_testing::internal::TemplateSel<SplitStringTest_random_long_prefix_delim_Test>,_testing::internal::Types<char32_t>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  pointer pbVar1;
  size_type *psVar2;
  pointer pcVar3;
  CodeLocation CVar4;
  _Alloc_hider _Var5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  SetUpTearDownSuiteFuncType p_Var8;
  SetUpTearDownSuiteFuncType p_Var9;
  undefined8 *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  size_t __n;
  type_info *ptVar13;
  char *pcVar14;
  type_info *ptVar15;
  type_info *ptVar16;
  long lVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 in_stack_fffffffffffffe98;
  type_info *in_stack_fffffffffffffea0;
  type_info *ptVar20;
  type_info *ptVar21;
  type_info *in_stack_fffffffffffffea8;
  TestFactoryBase *pTVar22;
  type_info local_150;
  undefined7 uStack_14f;
  undefined8 uStack_148;
  size_type *local_140;
  size_type local_138;
  size_type local_130;
  undefined8 uStack_128;
  type_info *local_120;
  type_info *local_118;
  long local_110;
  undefined8 uStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  int local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0 = type_names;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,prefix,(allocator<char> *)&stack0xfffffffffffffe9f);
  pcVar14 = "/";
  if (*prefix == '\0') {
    pcVar14 = "";
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,pcVar14);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_100.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_100.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_100._M_dataplus._M_p = (pointer)paVar12;
  }
  local_100._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_100,case_name);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_e0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_e0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_e0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_e0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_e0,"/");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if (paVar12 == paVar11) {
    local_c0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_c0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_c0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_c0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (local_a0->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_c0,pbVar1[index]._M_dataplus._M_p,pbVar1[index]._M_string_length);
  local_140 = &local_130;
  psVar2 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar12 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar12) {
    local_130 = paVar12->_M_allocated_capacity;
    uStack_128 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_130 = paVar12->_M_allocated_capacity;
    local_140 = psVar2;
  }
  psVar2 = local_140;
  local_138 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pcVar14 = strchr(test_names,0x2c);
  if (pcVar14 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffea0,test_names,(allocator<char> *)&local_98);
    ptVar13 = extraout_RDX_00;
  }
  else {
    in_stack_fffffffffffffea0 = &local_150;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffea0,test_names,pcVar14);
    ptVar13 = extraout_RDX;
  }
  local_118 = in_stack_fffffffffffffea8;
  if (in_stack_fffffffffffffea8 != (type_info *)0x0) {
    ptVar15 = in_stack_fffffffffffffea8 + (long)in_stack_fffffffffffffea0;
    ptVar21 = in_stack_fffffffffffffea0;
    do {
      ptVar20 = ptVar21;
      iVar6 = isspace((uint)(byte)ptVar15[-1]);
      ptVar13 = extraout_RDX_01;
      in_stack_fffffffffffffea0 = ptVar21;
      local_118 = in_stack_fffffffffffffea8;
      if (iVar6 == 0) break;
      ptVar16 = ptVar15 + -1;
      lVar17 = (long)ptVar16 - (long)ptVar21;
      in_stack_fffffffffffffea0 = ptVar20;
      if ((in_stack_fffffffffffffea8 != (type_info *)(lVar17 + 1)) &&
         (__n = (long)in_stack_fffffffffffffea8 - (lVar17 + 1), __n != 0)) {
        ptVar13 = ptVar21 + lVar17;
        if (__n == 1) {
          *ptVar13 = ptVar13[1];
        }
        else {
          memmove(ptVar13,ptVar21 + lVar17 + 1,__n);
          in_stack_fffffffffffffea0 = ptVar20;
        }
      }
      ptVar13 = in_stack_fffffffffffffea8 + -1;
      (in_stack_fffffffffffffea0 + -1)[(long)in_stack_fffffffffffffea8] = (type_info)0x0;
      ptVar15 = in_stack_fffffffffffffea0 + lVar17;
      bVar18 = ptVar16 != ptVar21;
      ptVar21 = in_stack_fffffffffffffea0;
      in_stack_fffffffffffffea8 = ptVar13;
      local_118 = ptVar13;
    } while (bVar18);
  }
  ptVar21 = &local_150;
  if (in_stack_fffffffffffffea0 == ptVar21) {
    uStack_108 = uStack_148;
    in_stack_fffffffffffffea0 = (type_info *)&local_110;
  }
  local_110 = CONCAT71(uStack_14f,local_150);
  pTVar22 = (TestFactoryBase *)0x0;
  local_150 = (type_info)0x0;
  local_120 = in_stack_fffffffffffffea0;
  GetTypeName_abi_cxx11_(&local_98,(internal *)&char32_t::typeinfo,ptVar13);
  _Var5._M_p = local_98._M_dataplus._M_p;
  pcVar3 = (code_location->file)._M_dataplus._M_p;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar3,pcVar3 + (code_location->file)._M_string_length);
  local_58 = code_location->line;
  p_Var8 = SuiteApiResolver<SplitStringTest_random_long_prefix_delim_Test<char32_t>_>::
           GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,local_58);
  p_Var9 = SuiteApiResolver<SplitStringTest_random_long_prefix_delim_Test<char32_t>_>::
           GetTearDownCaseOrSuite((code_location->file)._M_dataplus._M_p,code_location->line);
  uVar19 = 0x36ed7e;
  puVar10 = (undefined8 *)operator_new(8);
  *puVar10 = &PTR__TestFactoryBase_0055ece8;
  CVar4.file._M_string_length = (size_type)p_Var9;
  CVar4.file._M_dataplus._M_p = (pointer)p_Var8;
  CVar4.file.field_2._M_allocated_capacity = (size_type)puVar10;
  CVar4.file.field_2._8_8_ = uVar19;
  CVar4._32_8_ = in_stack_fffffffffffffe98;
  testing::internal::MakeAndRegisterTestInfo
            ((char *)psVar2,(char *)in_stack_fffffffffffffea0,_Var5._M_p,(char *)0x0,CVar4,local_78,
             (_func_void *)&TypeIdHelper<SplitStringTest<char32_t>>::dummy_,(_func_void *)ptVar21,
             pTVar22);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_120 != (type_info *)&local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (ptVar21 != &local_150) {
    operator_delete(ptVar21,CONCAT71(uStack_14f,local_150) + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }